

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::solutionResidual
          (MLCellLinOp *this,int amrlev,MultiFab *resid,MultiFab *x,MultiFab *b,
          MultiFab *crse_bcdata)

{
  int iVar1;
  int srccomp;
  int iVar2;
  pointer pMVar3;
  MultiFab *in_RCX;
  FabArrayBase *in_RDX;
  uint in_ESI;
  MultiFab *in_RDI;
  FabArrayBase *in_R8;
  MultiFab *in_R9;
  int mglev;
  int ncomp;
  char *in_stack_00000188;
  int in_stack_00000194;
  char *in_stack_00000198;
  char *in_stack_000001a0;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff98;
  undefined4 uVar4;
  FabArrayBase *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar1 = (*(in_RDI->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[5])();
  if (in_R9 != (MultiFab *)0x0) {
    updateSolBC((MLCellLinOp *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                (int)((ulong)in_RDX >> 0x20),in_RCX);
  }
  uVar4 = 0;
  this_00 = in_RDX;
  Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  ::operator[](in_stack_ffffffffffffff70,
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  pMVar3 = std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::get
                     ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
                      in_stack_ffffffffffffff70);
  (*(in_RDI->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[0xd])
            (in_RDI,(ulong)in_ESI,0,in_RDX,in_RCX,1,0,pMVar3);
  srccomp = FabArrayBase::nComp(this_00);
  iVar2 = FabArrayBase::nComp(in_R8);
  if (srccomp != iVar2) {
    Assert_host(in_stack_000001a0,in_stack_00000198,in_stack_00000194,in_stack_00000188);
  }
  MultiFab::Xpay(in_R9,(Real)CONCAT44(iVar1,uVar4),in_RDI,srccomp,in_stack_ffffffffffffff98,
                 (int)((ulong)in_RCX >> 0x20),(int)in_RCX);
  return;
}

Assistant:

void
MLCellLinOp::solutionResidual (int amrlev, MultiFab& resid, MultiFab& x, const MultiFab& b,
                               const MultiFab* crse_bcdata)
{
    BL_PROFILE("MLCellLinOp::solutionResidual()");
    const int ncomp = getNComp();
    if (crse_bcdata != nullptr) {
        updateSolBC(amrlev, *crse_bcdata);
    }
    const int mglev = 0;
    apply(amrlev, mglev, resid, x, BCMode::Inhomogeneous, StateMode::Solution,
          m_bndry_sol[amrlev].get());

    AMREX_ALWAYS_ASSERT(resid.nComp() == b.nComp());
    MultiFab::Xpay(resid, Real(-1.0), b, 0, 0, ncomp, 0);
}